

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int *piVar11;
  xml_attribute xVar12;
  byte *pbVar13;
  xpath_node *pxVar14;
  long lVar15;
  xpath_memory_block *pxVar16;
  char *pcVar17;
  byte bVar18;
  char_t cVar19;
  xml_node_struct *pxVar20;
  xpath_node *pxVar21;
  byte bVar22;
  xpath_ast_node *pxVar23;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar24;
  byte bVar25;
  char_t *pcVar26;
  less_equal *in_R8;
  undefined1 uVar27;
  xpath_memory_block *pxVar28;
  int *dst;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double v;
  xpath_allocator_capture local_f8;
  undefined1 local_d4;
  undefined3 uStack_d3;
  double local_d0;
  xpath_node_set_raw local_c8;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_d4 = xpath_type_none;
  uStack_d3 = 0;
LAB_001246b6:
  cVar6 = this->_type;
  uVar27 = xpath_type_node_set;
  switch(cVar6) {
  case '\x01':
    bVar9 = eval_boolean(this->_left,c,stack);
    lVar15 = 0x10;
    if (bVar9) goto switchD_00124705_caseD_2f;
    break;
  case '\x02':
    bVar9 = eval_boolean(this->_left,c,stack);
    lVar15 = 0x10;
    if (!bVar9) goto switchD_00124705_caseD_30;
    break;
  case '\x03':
    goto switchD_001246cd_caseD_3;
  case '\x04':
    pxVar23 = this->_left;
    this = this->_right;
    cVar6 = pxVar23->_rettype;
    cVar7 = this->_rettype;
    if ((cVar6 != '\x01') && (cVar7 != '\x01')) {
      if (cVar6 == '\x04' || cVar7 == '\x04') goto code_r0x0012475f;
      if (cVar6 == '\x02' || cVar7 == '\x02') {
        local_d0 = eval_number(pxVar23,c,stack);
        auVar32._0_8_ = eval_number(this,c,stack);
        auVar32._8_56_ = extraout_var_01;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_d0;
        uVar8 = vcmpsd_avx512f(auVar32._0_16_,auVar4,4);
        uVar27 = (char)uVar8 & xpath_type_node_set;
        goto switchD_00124705_caseD_2f;
      }
      if (cVar6 != '\x03' && cVar7 != '\x03') goto LAB_001253c2;
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,pxVar23,c,stack);
      eval_string((xpath_string *)&local_a8,this,c,stack);
      bVar9 = strequal((char_t *)local_c8._0_8_,(char_t *)local_a8._0_8_);
      goto LAB_001251bc;
    }
    if (cVar7 == '\x01' && cVar6 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,pxVar23,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
      if (local_c8._begin != local_c8._end) {
        pxVar14 = local_c8._end;
        pxVar16 = (xpath_memory_block *)local_a8._end;
        pxVar21 = local_c8._begin;
        do {
          pxVar28 = (xpath_memory_block *)local_a8._begin;
          if ((xpath_memory_block *)local_a8._begin != pxVar16) {
            do {
              local_80._target = stack->result;
              local_80._state._error = (local_80._target)->_error;
              local_80._state._root = (local_80._target)->_root;
              local_80._state._root_size = (local_80._target)->_root_size;
              string_value(&local_60,(anon_unknown_0 *)(pxVar21->_node)._root,
                           (xpath_node *)(pxVar21->_attribute)._attr,local_80._target);
              string_value(&local_48,(anon_unknown_0 *)pxVar28->next,(xpath_node *)pxVar28->capacity
                           ,stack->result);
              bVar9 = strequal(local_60._buffer,local_48._buffer);
              xpath_allocator_capture::~xpath_allocator_capture(&local_80);
              if (!bVar9) goto LAB_001250ac;
              pxVar16 = (xpath_memory_block *)&pxVar28->field_2;
              pxVar14 = local_c8._end;
              pxVar28 = pxVar16;
            } while (pxVar16 != (xpath_memory_block *)local_a8._end);
          }
          pxVar21 = pxVar21 + 1;
        } while (pxVar21 != pxVar14);
      }
      goto LAB_0012535d;
    }
    pxVar24 = pxVar23;
    if (cVar6 == '\x01') {
      pxVar24 = this;
      this = pxVar23;
      cVar6 = cVar7;
    }
    if (cVar6 == '\x02') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      local_d0 = eval_number(pxVar24,c,stack);
      eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0012535d;
      pxVar14 = local_c8._begin;
      goto LAB_001252e8;
    }
    if (cVar6 != '\x03') {
      if (cVar6 == '\x04') {
        bVar9 = eval_boolean(pxVar24,c,stack);
        bVar10 = eval_boolean(this,c,stack);
        local_d4 = local_d4 ^ bVar10 != bVar9;
        goto LAB_00124d11;
      }
LAB_001253c2:
      pcVar17 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
      ;
      goto LAB_001253b8;
    }
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_string((xpath_string *)&local_80,pxVar24,c,stack);
    eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
    if (local_c8._begin == local_c8._end) goto LAB_0012535d;
    pxVar14 = local_c8._begin;
    goto LAB_00125227;
  case '\x05':
    pxVar24 = this->_left;
    pxVar23 = this->_right;
    goto LAB_001248a7;
  case '\x06':
    pxVar23 = this->_left;
    pxVar24 = this->_right;
LAB_001248a7:
    uVar27 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar24,pxVar23,c,stack,(less *)in_R8);
    goto switchD_00124705_caseD_2f;
  case '\a':
    pxVar24 = this->_left;
    pxVar23 = this->_right;
    goto LAB_00124892;
  case '\b':
    pxVar23 = this->_left;
    pxVar24 = this->_right;
LAB_00124892:
    uVar27 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar24,pxVar23,c,stack,in_R8);
    goto switchD_00124705_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
switchD_001246cd_caseD_9:
    bVar18 = this->_rettype;
    goto LAB_00124838;
  case '\x14':
    bVar18 = this->_rettype;
    if (((this->_data).variable)->_type != (uint)bVar18) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2898,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (bVar18 == 4) {
      uVar27 = (undefined1)(this->_data).variable[1]._type;
      goto switchD_00124705_caseD_2f;
    }
LAB_00124838:
    if (bVar18 == 1) {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,this,c,stack,nodeset_eval_any);
      bVar9 = local_c8._begin == local_c8._end;
    }
    else {
      if (bVar18 != 3) {
        if (bVar18 != 2) {
          __assert_fail("false && \"Wrong expression for return type boolean\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x28b5,
                        "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                       );
        }
        auVar29._0_8_ = eval_number(this,c,stack);
        if ((auVar29._0_8_ != 0.0) || (NAN(auVar29._0_8_))) {
          auVar29._8_8_ = 0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = auVar29._0_8_;
          uVar8 = vcmpsd_avx512f(auVar29,auVar1,0);
          uVar27 = (char)uVar8 & xpath_type_node_set;
          goto switchD_00124705_caseD_2f;
        }
        goto switchD_00124705_caseD_30;
      }
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this,c,stack);
      bVar9 = *(byte *)local_c8._0_8_ == 0;
    }
LAB_00124a9b:
    uVar27 = !bVar9;
    goto LAB_00124a9f;
  default:
    lVar15 = 8;
    switch(cVar6) {
    case '\"':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      bVar18 = *(byte *)(xpath_memory_block **)local_a8._0_8_;
      if (bVar18 == 0) goto LAB_001250ac;
      lVar15 = 0;
      goto LAB_00124a0d;
    case '#':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      pcVar17 = strstr((char *)local_c8._0_8_,(char *)local_a8._0_8_);
      bVar9 = pcVar17 == (char *)0x0;
      goto LAB_00124a9b;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_001246cd_caseD_9;
    case '-':
      goto switchD_00124705_caseD_2d;
    case '.':
      bVar9 = eval_boolean(this->_left,c,stack);
      goto LAB_00124c66;
    case '/':
      goto switchD_00124705_caseD_2f;
    case '0':
      break;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_c8,this->_left,c,stack);
        uVar27 = false;
        pxVar20 = (c->n)._node._root;
        local_a8._0_8_ = (xml_node_struct *)0x0;
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          local_a8._0_8_ = pxVar20;
        }
        if ((xml_node_struct *)local_a8._0_8_ == (xml_node_struct *)0x0) goto LAB_00124a9f;
        goto LAB_00124921;
      }
      break;
    default:
      if (cVar6 != ';') goto switchD_001246cd_caseD_9;
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar11 = *(int **)(dst + 4);
        }
        else {
          piVar11 = (int *)0x0;
        }
        dst = (int *)0x185a74;
        if (piVar11 != (int *)0x0) {
          dst = piVar11;
        }
      }
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_f8._target = (xpath_allocator *)(c->n)._node._root;
      }
      else {
        local_f8._target = (xpath_allocator *)0x0;
      }
      xVar12 = xml_node::attribute((xml_node *)&local_f8,(this->_left->_data).string);
      if (xVar12._attr != (xml_attribute_struct *)0x0) {
        pcVar26 = (xVar12._attr)->value;
        if (pcVar26 == (char_t *)0x0) {
          pcVar26 = "";
        }
        bVar9 = strequal(pcVar26,(char_t *)dst);
        if (bVar9) {
          cVar19 = 'x';
          pcVar26 = "";
          if ((xVar12._attr)->name != (char_t *)0x0) {
            pcVar26 = (xVar12._attr)->name;
          }
          lVar15 = 0;
          goto LAB_00124ce2;
        }
      }
    }
switchD_00124705_caseD_30:
    uVar27 = xpath_type_none;
    goto switchD_00124705_caseD_2f;
  }
switchD_00124705_caseD_2d:
  this = *(xpath_ast_node **)(&this->_type + lVar15);
  goto LAB_001246b6;
  while( true ) {
    cVar19 = "xmlns"[lVar15 + 1];
    lVar15 = lVar15 + 1;
    if (lVar15 == 5) break;
LAB_00124ce2:
    if (pcVar26[lVar15] != cVar19) goto switchD_00124705_caseD_2f;
  }
  uVar27 = pcVar26[5] != ':' && pcVar26[5] != '\0';
  goto switchD_00124705_caseD_2f;
  while (pxVar20 = pxVar20->parent, local_a8._0_8_ = pxVar20, pxVar20 != (xml_node_struct *)0x0) {
LAB_00124921:
    xVar12 = xml_node::attribute((xml_node *)&local_a8,(char_t *)"xml:lang");
    if (xVar12._attr != (xml_attribute_struct *)0x0) {
      pbVar13 = (byte *)0x185a74;
      if ((xVar12._attr)->value != (byte *)0x0) {
        pbVar13 = (xVar12._attr)->value;
      }
      bVar18 = *(byte *)local_c8._0_8_;
      if (bVar18 != 0) goto LAB_00124dac;
      goto LAB_00124dee;
    }
  }
LAB_0012535d:
  uVar27 = false;
  goto LAB_00124a9f;
  while( true ) {
    bVar18 = *(byte *)local_c8._0_8_;
    pbVar13 = pbVar13 + 1;
    if (bVar18 == 0) break;
LAB_00124dac:
    local_c8._0_8_ = local_c8._0_8_ + 1;
    bVar22 = bVar18 | 0x20;
    if (0x19 < bVar18 - 0x41) {
      bVar22 = bVar18;
    }
    bVar18 = *pbVar13;
    bVar25 = bVar18 | 0x20;
    if (0x19 < bVar18 - 0x41) {
      bVar25 = bVar18;
    }
    if (bVar22 != bVar25) goto LAB_0012535d;
  }
LAB_00124dee:
  uVar27 = *pbVar13 == 0x2d || *pbVar13 == 0;
  goto LAB_00124a9f;
  while( true ) {
    bVar18 = *(byte *)((long)(xpath_memory_block **)local_a8._0_8_ + lVar15 + 1);
    lVar15 = lVar15 + 1;
    if (bVar18 == 0) break;
LAB_00124a0d:
    uVar27 = *(byte *)(local_c8._0_8_ + lVar15) == bVar18;
    if (!(bool)uVar27) break;
  }
  goto LAB_00124a9f;
  while (pxVar14 = pxVar14 + 1, pxVar14 != local_c8._end) {
LAB_001252e8:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value((xpath_string *)&local_80,(anon_unknown_0 *)(pxVar14->_node)._root,
                 (xpath_node *)(pxVar14->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
    auVar33._0_8_ = convert_string_to_number((char_t *)local_80._target);
    auVar33._8_56_ = extraout_var_02;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_d0;
    uVar8 = vcmpsd_avx512f(auVar33._0_16_,auVar5,4);
    uVar27 = (byte)uVar8 & 1;
    local_88 = auVar33._0_8_;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    if ((local_d0 != local_88) || (NAN(local_d0) || NAN(local_88))) break;
  }
  goto LAB_00124a9f;
code_r0x0012475f:
  bVar9 = eval_boolean(pxVar23,c,stack);
  local_d4 = local_d4 ^ bVar9;
  goto LAB_001246b6;
switchD_001246cd_caseD_3:
  pxVar23 = this->_left;
  pxVar24 = this->_right;
  cVar6 = pxVar23->_rettype;
  cVar7 = pxVar24->_rettype;
  if (cVar7 == '\x01' || cVar6 == '\x01') {
    if (cVar7 == '\x01' && cVar6 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,pxVar23,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,pxVar24,c,stack,nodeset_eval_all);
      if (local_c8._begin != local_c8._end) {
        pxVar14 = local_c8._end;
        pxVar16 = (xpath_memory_block *)local_a8._end;
        pxVar21 = local_c8._begin;
        do {
          pxVar28 = (xpath_memory_block *)local_a8._begin;
          if ((xpath_memory_block *)local_a8._begin != pxVar16) {
            do {
              local_80._target = stack->result;
              local_80._state._error = (local_80._target)->_error;
              local_80._state._root = (local_80._target)->_root;
              local_80._state._root_size = (local_80._target)->_root_size;
              string_value(&local_60,(anon_unknown_0 *)(pxVar21->_node)._root,
                           (xpath_node *)(pxVar21->_attribute)._attr,local_80._target);
              string_value(&local_48,(anon_unknown_0 *)pxVar28->next,(xpath_node *)pxVar28->capacity
                           ,stack->result);
              bVar9 = strequal(local_60._buffer,local_48._buffer);
              xpath_allocator_capture::~xpath_allocator_capture(&local_80);
              if (bVar9) goto LAB_001250ac;
              pxVar16 = (xpath_memory_block *)&pxVar28->field_2;
              pxVar14 = local_c8._end;
              pxVar28 = pxVar16;
            } while (pxVar16 != (xpath_memory_block *)local_a8._end);
          }
          pxVar21 = pxVar21 + 1;
        } while (pxVar21 != pxVar14);
      }
      goto LAB_0012535d;
    }
    this_00 = pxVar23;
    if (cVar6 == '\x01') {
      this_00 = pxVar24;
      pxVar24 = pxVar23;
      cVar6 = cVar7;
    }
    if (cVar6 == '\x02') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      local_d0 = eval_number(this_00,c,stack);
      eval_node_set(&local_c8,pxVar24,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0012535d;
      pxVar14 = local_c8._begin;
      do {
        local_a8._0_8_ = stack->result;
        local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
        local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
        local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
        string_value((xpath_string *)&local_80,(anon_unknown_0 *)(pxVar14->_node)._root,
                     (xpath_node *)(pxVar14->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
        auVar31._0_8_ = convert_string_to_number((char_t *)local_80._target);
        auVar31._8_56_ = extraout_var_00;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_d0;
        uVar8 = vcmpsd_avx512f(auVar31._0_16_,auVar3,0);
        uVar27 = (byte)uVar8 & 1;
        local_88 = auVar31._0_8_;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
        if ((local_d0 == local_88) && (!NAN(local_d0) && !NAN(local_88))) break;
        pxVar14 = pxVar14 + 1;
      } while (pxVar14 != local_c8._end);
    }
    else {
      if (cVar6 != '\x03') {
        if (cVar6 != '\x04') goto LAB_001253a3;
        bVar10 = eval_boolean(this_00,c,stack);
        goto LAB_00124c58;
      }
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_80,this_00,c,stack);
      eval_node_set(&local_c8,pxVar24,c,stack,nodeset_eval_all);
      if (local_c8._begin == local_c8._end) goto LAB_0012535d;
      pxVar14 = local_c8._begin;
      do {
        local_a8._0_8_ = stack->result;
        local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
        local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
        local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
        string_value(&local_60,(anon_unknown_0 *)(pxVar14->_node)._root,
                     (xpath_node *)(pxVar14->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
        uVar27 = strequal((char_t *)local_80._target,local_60._buffer);
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
        if ((bool)uVar27) break;
        pxVar14 = pxVar14 + 1;
      } while (pxVar14 != local_c8._end);
    }
    goto LAB_00124a9f;
  }
  if (cVar7 == '\x04' || cVar6 == '\x04') {
    bVar10 = eval_boolean(pxVar23,c,stack);
LAB_00124c58:
    bVar9 = eval_boolean(pxVar24,c,stack);
    bVar9 = (bool)(bVar9 ^ bVar10);
LAB_00124c66:
    local_d4 = local_d4 ^ bVar9 ^ xpath_type_node_set;
    goto LAB_00124d11;
  }
  if (cVar6 != '\x02' && cVar7 != '\x02') {
    if (cVar6 != '\x03' && cVar7 != '\x03') {
LAB_001253a3:
      pcVar17 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
      ;
LAB_001253b8:
      __assert_fail("false && \"Wrong types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x258a,pcVar17);
    }
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_string((xpath_string *)&local_c8,pxVar23,c,stack);
    eval_string((xpath_string *)&local_a8,pxVar24,c,stack);
    uVar27 = strequal((char_t *)local_c8._0_8_,(char_t *)local_a8._0_8_);
    goto LAB_00124a9f;
  }
  local_d0 = eval_number(pxVar23,c,stack);
  auVar30._0_8_ = eval_number(pxVar24,c,stack);
  auVar30._8_56_ = extraout_var;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d0;
  uVar8 = vcmpsd_avx512f(auVar30._0_16_,auVar2,0);
  uVar27 = (char)uVar8 & xpath_type_node_set;
  goto switchD_00124705_caseD_2f;
LAB_001250ac:
  uVar27 = true;
  goto LAB_00124a9f;
  while (pxVar14 = pxVar14 + 1, pxVar14 != local_c8._end) {
LAB_00125227:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value(&local_60,(anon_unknown_0 *)(pxVar14->_node)._root,
                 (xpath_node *)(pxVar14->_attribute)._attr,(xpath_allocator *)local_a8._0_8_);
    bVar9 = strequal((char_t *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    if (!bVar9) break;
  }
LAB_001251bc:
  uVar27 = bVar9 ^ 1;
LAB_00124a9f:
  xpath_allocator_capture::~xpath_allocator_capture(&local_f8);
switchD_00124705_caseD_2f:
  local_d4 = local_d4 ^ uVar27;
LAB_00124d11:
  return (bool)(local_d4 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_number:
					return convert_number_to_boolean(eval_number(c, stack));

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_string(c, stack).empty();
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_node_set(c, stack, nodeset_eval_any).empty();
				}

				default:
					assert(false && "Wrong expression for return type boolean"); // unreachable
					return false;
				}
			}
			}
		}